

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O1

unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> __thiscall
google::protobuf::SingleArena::GetArena(SingleArena *this)

{
  ParamType *pPVar1;
  ThreadSafeArena *this_00;
  
  pPVar1 = testing::WithParamInterface<bool>::GetParam();
  if (*pPVar1 == true) {
    (this->super_TestWithParam<bool>).super_Test._vptr_Test = (_func_int **)0x0;
    this_00 = (ThreadSafeArena *)0x0;
  }
  else {
    this_00 = (ThreadSafeArena *)operator_new(0xa8);
    protobuf::internal::ThreadSafeArena::ThreadSafeArena(this_00);
  }
  (this->super_TestWithParam<bool>).super_Test._vptr_Test = (_func_int **)this_00;
  return (__uniq_ptr_data<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Arena> GetArena() {
    if (this->GetParam()) return nullptr;
    return std::unique_ptr<Arena>(new Arena());
  }